

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::map_reader_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_map *tmap)

{
  int *piVar1;
  ostream *poVar2;
  string val;
  string desc;
  ostringstream out;
  string sStack_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  ostream local_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  temp_name_abi_cxx11_(&local_1b8,this);
  temp_name_abi_cxx11_(&local_1d8,this);
  poVar2 = std::operator<<(&local_198,"[|");
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"| ");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
  poVar2 = std::operator<<(&local_198,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2," := iprot readMapBegin.");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_238,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_238);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2," := Dictionary new.");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2," size timesRepeat: [");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&sStack_238);
  std::__cxx11::string::~string((string *)&local_218);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
  poVar2 = std::operator<<(&local_198,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2," at: ");
  read_val_abi_cxx11_(&sStack_238,this,tmap->key_type_);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_238);
  poVar2 = std::operator<<(poVar2," put: ");
  read_val_abi_cxx11_(&local_1f8,this,tmap->val_type_);
  std::operator<<(poVar2,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&sStack_238);
  std::__cxx11::string::~string((string *)&local_218);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = std::operator<<(&local_198,"].");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  poVar2 = std::operator<<(poVar2,"iprot readMapEnd.");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_238,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_238);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  std::operator<<(poVar2,"] value");
  std::__cxx11::string::~string((string *)&sStack_238);
  std::__cxx11::string::~string((string *)&local_218);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::map_reader(t_map* tmap) {
  std::ostringstream out;
  string desc = temp_name();
  string val = temp_name();

  out << "[|" << desc << " " << val << "| " << endl;
  indent_up();

  out << indent() << desc << " := iprot readMapBegin." << endl << indent() << val
      << " := Dictionary new." << endl << indent() << desc << " size timesRepeat: [" << endl;

  indent_up();
  out << indent() << val << " at: " << read_val(tmap->get_key_type())
      << " put: " << read_val(tmap->get_val_type());
  indent_down();

  out << "]." << endl << indent() << "iprot readMapEnd." << endl << indent() << val << "] value";
  indent_down();

  return out.str();
}